

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIService.h
# Opt level: O2

optional<libchess::UCIGoParameters> *
libchess::UCIService::parse_go_line
          (optional<libchess::UCIGoParameters> *__return_storage_ptr__,istringstream *line_stream)

{
  bool bVar1;
  bool ponder;
  istream *piVar2;
  long *plVar3;
  bool bVar4;
  bool infinite;
  optional<int> movestogo_opt;
  optional<int> binc_opt;
  optional<int> btime_opt;
  optional<int> winc_opt;
  optional<int> wtime_opt;
  optional<int> depth_opt;
  optional<int> movetime_opt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchmoves;
  _Storage<unsigned_long,_true> local_110;
  undefined1 local_108;
  int movestogo;
  _Optional_payload_base<libchess::UCIMoveList> local_b0;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  searchmoves_opt;
  string tmp;
  _Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  infinite = false;
  local_108 = 0;
  movetime_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = false;
  depth_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = false;
  wtime_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = false;
  winc_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = false;
  btime_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = false;
  binc_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = false;
  movestogo_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = false;
  searchmoves_opt.
  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_engaged = false;
  searchmoves.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  searchmoves.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  searchmoves.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp.field_2._M_local_buf[0] = '\0';
  ponder = false;
LAB_00126790:
  do {
    bVar4 = false;
LAB_00126792:
    piVar2 = std::operator>>((istream *)line_stream,(string *)&tmp);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
LAB_00126ac9:
      if (searchmoves.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          searchmoves.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
        operator=((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)&searchmoves_opt,&searchmoves);
      }
      std::
      _Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ::_Optional_base((_Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                        *)&local_50,
                       &searchmoves_opt.
                        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                      );
      UCIGoParameters::UCIGoParameters
                ((UCIGoParameters *)&movestogo,(optional<unsigned_long> *)&local_110,&movetime_opt,
                 &depth_opt,&wtime_opt,&winc_opt,&btime_opt,&binc_opt,&movestogo_opt,infinite,ponder
                 ,(optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_50);
      std::optional<libchess::UCIGoParameters>::optional<libchess::UCIGoParameters,_true>
                (__return_storage_ptr__,(UCIGoParameters *)&movestogo);
      std::_Optional_payload_base<libchess::UCIMoveList>::_M_reset(&local_b0);
      std::
      _Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_reset(&local_50);
      std::__cxx11::string::~string((string *)&tmp);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&searchmoves);
      std::
      _Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_reset((_Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&searchmoves_opt);
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==(&tmp,"nodes");
    if (bVar1) {
      _movestogo = 0;
      piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)line_stream);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
        local_110._M_value = _movestogo;
        local_108 = 1;
      }
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"movetime");
    if (bVar1) {
      _movestogo = _movestogo & 0xffffffff00000000;
      plVar3 = (long *)std::istream::operator>>((istream *)line_stream,&movestogo);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        movetime_opt.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_base<int,_true,_true>)(_movestogo & 0xffffffff | 0x100000000);
      }
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"depth");
    if (bVar1) {
      _movestogo = _movestogo & 0xffffffff00000000;
      plVar3 = (long *)std::istream::operator>>((istream *)line_stream,&movestogo);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        depth_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
             = (_Optional_base<int,_true,_true>)(_movestogo & 0xffffffff | 0x100000000);
      }
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"wtime");
    if (bVar1) {
      _movestogo = _movestogo & 0xffffffff00000000;
      plVar3 = (long *)std::istream::operator>>((istream *)line_stream,&movestogo);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        wtime_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
             = (_Optional_base<int,_true,_true>)(_movestogo & 0xffffffff | 0x100000000);
      }
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"winc");
    if (bVar1) {
      _movestogo = _movestogo & 0xffffffff00000000;
      plVar3 = (long *)std::istream::operator>>((istream *)line_stream,&movestogo);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        winc_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
             = (_Optional_base<int,_true,_true>)(_movestogo & 0xffffffff | 0x100000000);
      }
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"btime");
    if (bVar1) {
      _movestogo = _movestogo & 0xffffffff00000000;
      plVar3 = (long *)std::istream::operator>>((istream *)line_stream,&movestogo);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        btime_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
             = (_Optional_base<int,_true,_true>)(_movestogo & 0xffffffff | 0x100000000);
      }
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"binc");
    if (bVar1) {
      _movestogo = _movestogo & 0xffffffff00000000;
      plVar3 = (long *)std::istream::operator>>((istream *)line_stream,&movestogo);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        binc_opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
             = (_Optional_base<int,_true,_true>)(_movestogo & 0xffffffff | 0x100000000);
      }
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"movestogo");
    if (bVar1) {
      _movestogo = _movestogo & 0xffffffff00000000;
      plVar3 = (long *)std::istream::operator>>((istream *)line_stream,&movestogo);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        movestogo_opt.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_base<int,_true,_true>)(_movestogo & 0xffffffff | 0x100000000);
      }
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"infinite");
    if (bVar1) {
      infinite = true;
      goto LAB_00126790;
    }
    bVar1 = std::operator==(&tmp,"ponder");
    if (!bVar1) {
      bVar1 = std::operator==(&tmp,"searchmoves");
      if (bVar1) {
        bVar4 = true;
      }
      else {
        if (!bVar4) goto LAB_00126ac9;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&searchmoves,&tmp);
      }
      goto LAB_00126792;
    }
    ponder = true;
  } while( true );
}

Assistant:

static std::optional<UCIGoParameters> parse_go_line(std::istringstream& line_stream) noexcept {
        std::optional<std::uint64_t> nodes_opt;
        std::optional<int> movetime_opt;
        std::optional<int> depth_opt;
        std::optional<int> wtime_opt;
        std::optional<int> winc_opt;
        std::optional<int> btime_opt;
        std::optional<int> binc_opt;
        std::optional<int> movestogo_opt;
        bool infinite = false;
        bool ponder = false;
        std::optional<std::vector<std::string>> searchmoves_opt;

        std::vector<std::string> searchmoves;
        bool filling_searchmoves = false;
        std::string tmp;
        while (line_stream >> tmp) {
            if (tmp == "nodes") {
                std::uint64_t nodes = 0;
                if (line_stream >> nodes) {
                    nodes_opt = nodes;
                }
            } else if (tmp == "movetime") {
                int movetime = 0;
                if (line_stream >> movetime) {
                    movetime_opt = movetime;
                }
            } else if (tmp == "depth") {
                int depth = 0;
                if (line_stream >> depth) {
                    depth_opt = depth;
                }
            } else if (tmp == "wtime") {
                int wtime = 0;
                if (line_stream >> wtime) {
                    wtime_opt = wtime;
                }
            } else if (tmp == "winc") {
                int winc = 0;
                if (line_stream >> winc) {
                    winc_opt = winc;
                }
            } else if (tmp == "btime") {
                int btime = 0;
                if (line_stream >> btime) {
                    btime_opt = btime;
                }
            } else if (tmp == "binc") {
                int binc = 0;
                if (line_stream >> binc) {
                    binc_opt = binc;
                }
            } else if (tmp == "movestogo") {
                int movestogo = 0;
                if (line_stream >> movestogo) {
                    movestogo_opt = movestogo;
                }
            } else if (tmp == "infinite") {
                infinite = true;
            } else if (tmp == "ponder") {
                ponder = true;
            } else if (tmp == "searchmoves") {
                filling_searchmoves = true;
                continue;
            } else if (filling_searchmoves) {
                searchmoves.push_back(tmp);
                continue;
            } else {
                break;
            }
            filling_searchmoves = false;
        }
        if (!searchmoves.empty()) {
            searchmoves_opt = searchmoves;
        }

        return UCIGoParameters{nodes_opt,
                               movetime_opt,
                               depth_opt,
                               wtime_opt,
                               winc_opt,
                               btime_opt,
                               binc_opt,
                               movestogo_opt,
                               infinite,
                               ponder,
                               searchmoves_opt};
    }